

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_markdown_generator.cc
# Opt level: O0

string * __thiscall
t_markdown_generator::escape_html
          (string *__return_storage_ptr__,t_markdown_generator *this,string *str)

{
  size_t sVar1;
  ulong uVar2;
  ulong uVar3;
  byte *pbVar4;
  ulong uVar5;
  ostream *poVar6;
  undefined8 *puVar7;
  string local_220;
  string local_200 [32];
  string local_1e0 [48];
  ulong local_1b0;
  size_t firstpos;
  size_t lastpos;
  uint ic;
  uchar c;
  ostringstream result;
  string *str_local;
  t_markdown_generator *this_local;
  
  result._368_8_ = str;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&ic);
  lastpos._7_1_ = 0x3f;
  lastpos._0_4_ = 0;
  local_1b0 = 0;
LAB_00305bdb:
  do {
    uVar3 = local_1b0;
    uVar2 = std::__cxx11::string::length();
    if (uVar2 <= uVar3) {
LAB_00305f50:
      std::__cxx11::ostringstream::str();
      escape_html_tags(__return_storage_ptr__,this,&local_220);
      std::__cxx11::string::~string((string *)&local_220);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ic);
      return __return_storage_ptr__;
    }
    for (firstpos = local_1b0; sVar1 = firstpos, uVar3 = std::__cxx11::string::length(),
        sVar1 < uVar3; firstpos = firstpos + 1) {
      pbVar4 = (byte *)std::__cxx11::string::at(result._368_8_);
      lastpos._7_1_ = *pbVar4;
      lastpos._0_4_ = (uint)lastpos._7_1_;
      if (((uint)lastpos < 0x20) || (0x7f < (uint)lastpos)) break;
    }
    if (local_1b0 < firstpos) {
      std::__cxx11::string::substr((ulong)local_1e0,result._368_8_);
      std::operator<<((ostream *)&ic,local_1e0);
      std::__cxx11::string::~string(local_1e0);
      local_1b0 = firstpos;
    }
    uVar3 = local_1b0;
    uVar5 = std::__cxx11::string::length();
    uVar2 = local_1b0;
    if (uVar5 <= uVar3) goto LAB_00305f50;
    if ((uint)lastpos < 0x20) {
      if ((lastpos._7_1_ - 9 < 2) || (lastpos._7_1_ == 0xd)) {
        std::operator<<((ostream *)&ic,' ');
      }
      local_1b0 = local_1b0 + 1;
      goto LAB_00305bdb;
    }
    uVar3 = std::__cxx11::string::length();
    if (uVar3 <= uVar2) goto LAB_00305f50;
    if ((this->input_type_ == INPUT_UNKNOWN) &&
       (detect_input_encoding(this,(string *)result._368_8_,local_1b0),
       this->input_type_ == INPUT_UTF8)) {
      firstpos = std::__cxx11::string::length();
      std::__cxx11::string::substr((ulong)local_200,result._368_8_);
      std::operator<<((ostream *)&ic,local_200);
      std::__cxx11::string::~string(local_200);
      goto LAB_00305f50;
    }
    if (this->input_type_ != INPUT_PLAIN) {
      puVar7 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar7 = "Unexpected or unrecognized input encoding";
      __cxa_throw(puVar7,&char_const*::typeinfo,0);
    }
    poVar6 = std::operator<<((ostream *)&ic,"&#");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,(uint)lastpos);
    std::operator<<(poVar6,";");
    local_1b0 = local_1b0 + 1;
  } while( true );
}

Assistant:

std::string t_markdown_generator::escape_html(std::string const& str) {
  // the generated HTML header says it is UTF-8 encoded
  // if UTF-8 input has been detected before, we don't need to change anything
  //if (input_type_ == INPUT_UTF8) {
  //  return escape_html_tags(str);
  //}

  // convert unsafe chars to their &#<num>; equivalent
  std::ostringstream result;
  unsigned char c = '?';
  unsigned int ic = 0;
  size_t lastpos;
  size_t firstpos = 0;
  while (firstpos < str.length()) {

    // look for non-ASCII char
    lastpos = firstpos;
    while (lastpos < str.length()) {
      c = str.at(lastpos);
      ic = c;
      if ((32 > ic) || (127 < ic)) {
        break;
      }
      ++lastpos;
    }

    // copy what we got so far
    if (lastpos > firstpos) {
      result << str.substr(firstpos, lastpos - firstpos);
      firstpos = lastpos;
    }

    // reached the end?
    if (firstpos >= str.length()) {
      break;
    }

    // some control code?
    if (ic <= 31) {
      switch (c) {
      case '\r':
      case '\n':
      case '\t':
        result << ' ';
        break;
      default: // silently consume all other ctrl chars
        break;
      }
      ++firstpos;
      continue;
    }

    // reached the end?
    if (firstpos >= str.length()) {
      break;
    }

    // try to detect input encoding
    if (input_type_ == INPUT_UNKNOWN) {
      detect_input_encoding(str, firstpos);
      if (input_type_ == INPUT_UTF8) {
        lastpos = str.length();
        result << str.substr(firstpos, lastpos - firstpos);
        break;
      }
    }

    // convert the character to something useful based on the detected encoding
    switch (input_type_) {
    case INPUT_PLAIN:
      result << "&#" << ic << ";";
      ++firstpos;
      break;
    default:
      throw "Unexpected or unrecognized input encoding";
    }
  }

  return escape_html_tags(result.str());
}